

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# options.h
# Opt level: O1

string * __thiscall
bandit::detail::option_map::comma_separated_list_abi_cxx11_
          (string *__return_storage_ptr__,option_map *this)

{
  _Rb_tree_node_base *p_Var1;
  _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(bandit::detail::controller_t_&)>_>_>
  __first;
  _Rb_tree_header *__last;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  p_Var1 = (this->map)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  __last = &(this->map)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var1 == __last) {
    std::__cxx11::string::_M_replace((ulong)__return_storage_ptr__,0,(char *)0x0,0x1178cd);
  }
  else {
    std::__cxx11::string::_M_append((char *)__return_storage_ptr__,*(ulong *)(p_Var1 + 1));
    __first._M_node = (_Base_ptr)std::_Rb_tree_increment(p_Var1);
    std::
    for_each<std::_Rb_tree_const_iterator<std::pair<std::__cxx11::string_const,std::function<void(bandit::detail::controller_t&)>>>,bandit::detail::option_map::comma_separated_list()const::_lambda(std::pair<std::__cxx11::string,std::function<void(bandit::detail::controller_t&)>>const&)_1_>
              (__first,(_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(bandit::detail::controller_t_&)>_>_>
                        )__last,(anon_class_8_1_ba1d3d5c)__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string comma_separated_list() const {
        std::string csl;
        auto it = map.begin();
        if (it != map.end()) {
          csl += it->first;
          std::for_each(++it, map.end(), [&](const std::pair<std::string, controller_func_t>& val) {
            csl += ", " + val.first;
          });
        } else {
          csl = "[no registered entities]";
        }
        return csl;
      }